

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<char>_>::int_writer
          (int_writer<unsigned_long_long,_fmt::v6::basic_format_specs<char>_> *this,
          basic_writer<fmt::v6::buffer_range<char>_> *w,unsigned_long_long value,
          basic_format_specs<char> *s)

{
  bool bVar1;
  undefined8 in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined1 local_29;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RCX;
  in_RDI[2] = CONCAT71(in_register_00000011,in_DL);
  *(undefined4 *)((long)in_RDI + 0x1c) = 0;
  bVar1 = is_negative<unsigned_long_long,_0>(CONCAT71(in_register_00000011,in_DL));
  if (bVar1) {
    *(undefined1 *)(in_RDI + 3) = 0x2d;
    *(int *)((long)in_RDI + 0x1c) = *(int *)((long)in_RDI + 0x1c) + 1;
    in_RDI[2] = -in_RDI[2];
  }
  else if (((*(byte *)(in_RDI[1] + 9) >> 4 & 7) != 0) && ((*(byte *)(in_RDI[1] + 9) >> 4 & 7) != 1))
  {
    local_29 = 0x2b;
    if ((*(byte *)(in_RDI[1] + 9) >> 4 & 7) != 2) {
      local_29 = 0x20;
    }
    *(undefined1 *)(in_RDI + 3) = local_29;
    *(int *)((long)in_RDI + 0x1c) = *(int *)((long)in_RDI + 0x1c) + 1;
  }
  return;
}

Assistant:

int_writer(basic_writer<Range>& w, Int value, const Specs& s)
        : writer(w),
          specs(s),
          abs_value(static_cast<unsigned_type>(value)),
          prefix_size(0) {
      if (is_negative(value)) {
        prefix[0] = '-';
        ++prefix_size;
        abs_value = 0 - abs_value;
      } else if (specs.sign != sign::none && specs.sign != sign::minus) {
        prefix[0] = specs.sign == sign::plus ? '+' : ' ';
        ++prefix_size;
      }
    }